

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O2

void __thiscall FZFile::gen_outline(FZFile *this)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  int iVar6;
  pointer pBVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  BRDPoint local_38;
  
  pBVar2 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->super_BRDFileBase).pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pBVar5 = pBVar2;
  pBVar3 = pBVar2;
  if (pBVar2 == pBVar1) {
    iVar6 = (pBVar2->pos).x;
    iVar8 = (pBVar2->pos).y;
    iVar10 = iVar6;
  }
  else {
    while (pBVar4 = pBVar5, pBVar3 = pBVar3 + 1, pBVar3 != pBVar1) {
      pBVar5 = pBVar3;
      if ((pBVar4->pos).x <= (pBVar3->pos).x) {
        pBVar5 = pBVar4;
      }
    }
    iVar6 = (pBVar4->pos).x;
    pBVar5 = pBVar2;
    pBVar3 = pBVar2;
    while( true ) {
      pBVar7 = pBVar5;
      pBVar3 = pBVar3 + 1;
      iVar10 = (pBVar7->pos).x;
      pBVar4 = pBVar2;
      pBVar5 = pBVar2;
      if (pBVar3 == pBVar1) break;
      pBVar5 = pBVar3;
      if ((pBVar3->pos).x <= iVar10) {
        pBVar5 = pBVar7;
      }
    }
    while (pBVar3 = pBVar4, pBVar4 = pBVar5 + 1, pBVar4 != pBVar1) {
      pBVar7 = pBVar5 + 1;
      pBVar5 = pBVar4;
      if ((pBVar3->pos).y <= (pBVar7->pos).y) {
        pBVar4 = pBVar3;
      }
    }
    iVar8 = (pBVar3->pos).y;
    pBVar5 = pBVar2;
    pBVar3 = pBVar2;
    while (pBVar2 = pBVar5, pBVar5 = pBVar3 + 1, pBVar5 != pBVar1) {
      pBVar4 = pBVar3 + 1;
      pBVar3 = pBVar5;
      if ((pBVar4->pos).y <= (pBVar2->pos).y) {
        pBVar5 = pBVar2;
      }
    }
  }
  iVar6 = iVar6 + -0x14;
  iVar8 = iVar8 + -0x14;
  iVar9 = (pBVar2->pos).y + 0x14;
  this_00 = &(this->super_BRDFileBase).format;
  local_38.y = iVar8;
  local_38.x = iVar6;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar10 + 0x14;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar9;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.x = iVar6;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  local_38.y = iVar8;
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>(this_00,&local_38);
  return;
}

Assistant:

void FZFile::gen_outline() {
	// Determine board outline
	int minx =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x - OUTLINE_MARGIN;
	int maxx =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.x < b.pos.x; })->pos.x + OUTLINE_MARGIN;
	int miny =
	    std::min_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y - OUTLINE_MARGIN;
	int maxy =
	    std::max_element(pins.begin(), pins.end(), [](BRDPin a, BRDPin b) { return a.pos.y < b.pos.y; })->pos.y + OUTLINE_MARGIN;
	format.push_back({minx, miny});
	format.push_back({maxx, miny});
	format.push_back({maxx, maxy});
	format.push_back({minx, maxy});
	format.push_back({minx, miny});
}